

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O2

ssize_t Curl_bufq_write(bufq *q,uchar *buf,size_t len,CURLcode *err)

{
  buf_chunk *pbVar1;
  ulong uVar2;
  ulong uVar3;
  CURLcode local_40;
  
  local_40 = CURLE_OK;
  uVar2 = 0;
  do {
    uVar3 = uVar2;
    if (len == 0) {
LAB_00112760:
      *err = local_40;
      return uVar3;
    }
    pbVar1 = get_non_full_tail(q);
    if (pbVar1 == (buf_chunk *)0x0) {
      local_40 = CURLE_OUT_OF_MEMORY;
      uVar3 = 0xffffffffffffffff;
      if ((q->max_chunks <= q->chunk_count) && ((q->opts & 1) == 0)) {
LAB_00112746:
        local_40 = CURLE_AGAIN;
        if (uVar2 != 0) {
          local_40 = CURLE_OK;
        }
        uVar3 = -(ulong)(uVar2 == 0) | uVar2;
      }
      goto LAB_00112760;
    }
    uVar3 = pbVar1->dlen - pbVar1->w_offset;
    if (uVar3 == 0) goto LAB_00112746;
    if (len <= uVar3) {
      uVar3 = len;
    }
    memcpy((void *)((long)&pbVar1->x + pbVar1->w_offset),buf,uVar3);
    pbVar1->w_offset = pbVar1->w_offset + uVar3;
    uVar2 = uVar2 + uVar3;
    buf = buf + uVar3;
    len = len - uVar3;
  } while( true );
}

Assistant:

ssize_t Curl_bufq_write(struct bufq *q,
                        const unsigned char *buf, size_t len,
                        CURLcode *err)
{
  struct buf_chunk *tail;
  ssize_t nwritten = 0;
  size_t n;

  DEBUGASSERT(q->max_chunks > 0);
  while(len) {
    tail = get_non_full_tail(q);
    if(!tail) {
      if((q->chunk_count < q->max_chunks) || (q->opts & BUFQ_OPT_SOFT_LIMIT)) {
        *err = CURLE_OUT_OF_MEMORY;
        return -1;
      }
      break;
    }
    n = chunk_append(tail, buf, len);
    if(!n)
      break;
    nwritten += n;
    buf += n;
    len -= n;
  }
  if(nwritten == 0 && len) {
    *err = CURLE_AGAIN;
    return -1;
  }
  *err = CURLE_OK;
  return nwritten;
}